

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::AnsiPortListSyntax::AnsiPortListSyntax
          (AnsiPortListSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::MemberSyntax> *ports,Token closeParen)

{
  bool bVar1;
  size_t in_RDX;
  SyntaxNode *in_RSI;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *in_RDI;
  pointer in_R8;
  size_t in_R9;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *__range2;
  MemberSyntax *in_stack_ffffffffffffffa0;
  
  PortListSyntax::PortListSyntax
            ((PortListSyntax *)in_stack_ffffffffffffffa0,(SyntaxKind)((ulong)in_RDI >> 0x20));
  (in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode = in_RSI;
  (in_RDI->super_SyntaxListBase).childCount = in_RDX;
  SeparatedSyntaxList<slang::syntax::MemberSyntax>::SeparatedSyntaxList
            ((SeparatedSyntaxList<slang::syntax::MemberSyntax> *)in_stack_ffffffffffffffa0,in_RDI);
  in_RDI[1].elements._M_ptr = in_R8;
  in_RDI[1].elements._M_extent._M_extent_value = in_R9;
  in_RDI[1].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)in_RDI;
  SeparatedSyntaxList<slang::syntax::MemberSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::MemberSyntax> *)0x27f556);
  SeparatedSyntaxList<slang::syntax::MemberSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::MemberSyntax> *)in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffffa0,
                       (iterator_base<slang::syntax::MemberSyntax_*> *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffa0 =
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_false>
                      *)0x27f595);
    (in_stack_ffffffffffffffa0->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<slang::syntax::MemberSyntax_*>,_false>
                *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

AnsiPortListSyntax(Token openParen, const SeparatedSyntaxList<MemberSyntax>& ports, Token closeParen) :
        PortListSyntax(SyntaxKind::AnsiPortList), openParen(openParen), ports(ports), closeParen(closeParen) {
        this->ports.parent = this;
        for (auto child : this->ports)
            child->parent = this;
    }